

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O3

void dasm_growpc(BuildCtx *ctx,uint maxpc)

{
  dasm_State *pdVar1;
  ulong uVar2;
  ulong uVar3;
  int *piVar4;
  ulong __size;
  
  pdVar1 = ctx->D;
  uVar2 = pdVar1->pcsize;
  if (uVar2 < (ulong)maxpc << 2) {
    uVar3 = 0x10;
    if (0x10 < uVar2) {
      uVar3 = uVar2;
    }
    do {
      __size = uVar3;
      uVar3 = __size * 2;
    } while (__size < (ulong)maxpc << 2);
    piVar4 = (int *)realloc(pdVar1->pclabels,__size);
    pdVar1->pclabels = piVar4;
    if (piVar4 == (int *)0x0) {
      exit(1);
    }
    pdVar1->pcsize = __size;
  }
  else {
    piVar4 = pdVar1->pclabels;
    __size = uVar2;
  }
  memset((void *)((long)piVar4 + uVar2),0,__size - uVar2);
  return;
}

Assistant:

void dasm_growpc(Dst_DECL, unsigned int maxpc)
{
  dasm_State *D = Dst_REF;
  size_t osz = D->pcsize;
  DASM_M_GROW(Dst, int, D->pclabels, D->pcsize, maxpc*sizeof(int));
  memset((void *)(((unsigned char *)D->pclabels)+osz), 0, D->pcsize-osz);
}